

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O1

void start_output_pass(j_decompress_ptr cinfo)

{
  jpeg_d_coef_controller *pjVar1;
  JQUANT_TBL *pJVar2;
  int (*paiVar3) [64];
  bool bVar4;
  _func_void_j_decompress_ptr *p_Var5;
  code *pcVar6;
  jpeg_component_info *pjVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  my_coef_ptr coef;
  
  pjVar1 = cinfo->coef;
  if (pjVar1->coef_arrays == (jvirt_barray_ptr *)0x0) goto LAB_00282734;
  if (((cinfo->do_block_smoothing == 0) || (cinfo->progressive_mode == 0)) ||
     (cinfo->coef_bits == (int (*) [64])0x0)) {
LAB_00282729:
    pcVar6 = decompress_data;
  }
  else {
    if (pjVar1[5].start_output_pass == (_func_void_j_decompress_ptr *)0x0) {
      p_Var5 = (_func_void_j_decompress_ptr *)
               (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,(long)cinfo->num_components * 0x18);
      pjVar1[5].start_output_pass = p_Var5;
    }
    if (cinfo->num_components < 1) goto LAB_00282729;
    pjVar7 = cinfo->comp_info;
    p_Var5 = pjVar1[5].start_output_pass;
    lVar8 = 0;
    lVar9 = 0;
    bVar4 = false;
    do {
      pJVar2 = pjVar7->quant_table;
      if (((((pJVar2 == (JQUANT_TBL *)0x0) || (pJVar2->quantval[0] == 0)) ||
           ((pJVar2->quantval[1] == 0 ||
            ((pJVar2->quantval[8] == 0 || (pJVar2->quantval[0x10] == 0)))))) ||
          (pJVar2->quantval[9] == 0)) ||
         ((pJVar2->quantval[2] == 0 || (paiVar3 = cinfo->coef_bits, paiVar3[lVar9][0] < 0)))) {
        bVar4 = false;
        break;
      }
      lVar10 = 1;
      do {
        *(undefined4 *)(p_Var5 + lVar10 * 4) = *(undefined4 *)((long)*paiVar3 + lVar10 * 4 + lVar8);
        if (*(int *)((long)*paiVar3 + lVar10 * 4 + lVar8) != 0) {
          bVar4 = true;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 6);
      p_Var5 = p_Var5 + 0x18;
      lVar9 = lVar9 + 1;
      pjVar7 = pjVar7 + 1;
      lVar8 = lVar8 + 0x100;
    } while (lVar9 < cinfo->num_components);
    if (!bVar4) goto LAB_00282729;
    pcVar6 = decompress_smooth_data;
  }
  pjVar1->decompress_data = pcVar6;
LAB_00282734:
  cinfo->output_iMCU_row = 0;
  return;
}

Assistant:

METHODDEF(void)
start_output_pass (j_decompress_ptr cinfo)
{
#ifdef BLOCK_SMOOTHING_SUPPORTED
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;

  /* If multipass, check to see whether to use block smoothing on this pass */
  if (coef->pub.coef_arrays != NULL) {
    if (cinfo->do_block_smoothing && smoothing_ok(cinfo))
      coef->pub.decompress_data = decompress_smooth_data;
    else
      coef->pub.decompress_data = decompress_data;
  }
#endif
  cinfo->output_iMCU_row = 0;
}